

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<kj::StringTree>::dispose(ArrayBuilder<kj::StringTree> *this)

{
  StringTree *pSVar1;
  RemoveConst<kj::StringTree> *pRVar2;
  StringTree *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringTree *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (StringTree *)0x0;
    this->pos = (RemoveConst<kj::StringTree> *)0x0;
    this->endPtr = (StringTree *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pSVar1,0x38,((long)pRVar2 - (long)pSVar1) / 0x38,
               ((long)pSVar3 - (long)pSVar1) / 0x38,
               ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }